

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> * __thiscall
wasm::WATParser::anon_unknown_0::ident
          (optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *__return_storage_ptr__,
          anon_unknown_0 *this,string_view in)

{
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var1;
  bool bVar2;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var3;
  char *pcVar4;
  char *extraout_RDX;
  bool *__return_storage_ptr___00;
  string_view in_00;
  string_view in_01;
  string_view str;
  string_view sVar5;
  undefined1 local_d8 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed_1;
  LexIdCtx ctx;
  optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> s;
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed;
  
  ctx.super_LexCtx.input._M_len = in._M_len;
  ctx.super_LexCtx.input._M_str = (char *)0x0;
  pcVar4 = (char *)0x0;
  ctx.super_LexCtx.lexedSize._0_1_ = 0;
  ctx.str.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = 0;
  sVar5._M_str = "$";
  sVar5._M_len = 1;
  lexed_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_
       = this;
  bVar2 = LexCtx::takePrefix((LexCtx *)
                             &lexed_1.
                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                              ._M_engaged,sVar5);
  if (bVar2) {
    sVar5 = LexCtx::next((LexCtx *)
                         &lexed_1.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                          ._M_engaged);
    __return_storage_ptr___00 =
         &ctx.str.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged;
    anon_unknown_0::str((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)
                        __return_storage_ptr___00,sVar5);
    if (s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
        _M_payload._M_value.str.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      if (s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
          ._M_payload.
          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
          .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
          _M_payload._40_1_ != '\0') {
        __return_storage_ptr___00 =
             (bool *)((long)&s.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                             ._M_payload.
                             super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                             .
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                             ._M_payload + 0x10);
      }
      p_Var1 = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&s.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                          ._M_payload.
                          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                          .
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                          ._M_payload._M_value.super_LexResult + 8);
      p_Var3 = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&s;
      if (s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
          ._M_payload.
          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
          .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
          _M_payload._40_1_ != '\0') {
        p_Var3 = p_Var1;
      }
      str._M_str = extraout_RDX;
      str._M_len = (size_t)(p_Var3->_M_payload)._M_value._M_dataplus._M_p;
      bVar2 = String::isUTF8(*(String **)__return_storage_ptr___00,str);
      if (!bVar2) {
LAB_00c0160b:
        (__return_storage_ptr__->
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>).
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
        _M_engaged = false;
        std::_Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>::
        ~_Optional_base((_Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                         *)&ctx.str.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_engaged);
        goto LAB_00c01618;
      }
      ctx.super_LexCtx.lexedSize._0_1_ = 1;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_copy_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&ctx.isStr,p_Var1);
      ctx.super_LexCtx.input._M_str =
           ctx.super_LexCtx.input._M_str +
           ctx.str.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._32_8_;
    }
    else {
      sVar5 = LexCtx::next((LexCtx *)
                           &lexed_1.
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                            ._M_engaged);
      in_00._M_len = sVar5._M_str;
      in_00._M_str = pcVar4;
      idchar((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
             &s.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
              ._M_payload.
              super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
              .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
              _M_engaged,(anon_unknown_0 *)sVar5._M_len,in_00);
      if (lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._8_1_ != '\x01') goto LAB_00c0160b;
      ctx.super_LexCtx.input._M_str =
           ctx.super_LexCtx.input._M_str +
           s.
           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
           _M_payload.
           super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
           .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
           _56_8_;
      while( true ) {
        sVar5 = LexCtx::next((LexCtx *)
                             &lexed_1.
                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                              ._M_engaged);
        in_01._M_len = sVar5._M_str;
        in_01._M_str = pcVar4;
        idchar((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_d8,
               (anon_unknown_0 *)sVar5._M_len,in_01);
        if (lexed_1.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
            _M_payload._8_1_ == '\0') break;
        ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + (long)local_d8;
      }
    }
    std::_Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>::
    ~_Optional_base((_Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                     *)&ctx.str.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_engaged);
    bVar2 = LexCtx::canFinish((LexCtx *)
                              &lexed_1.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                               ._M_engaged);
    if (bVar2) {
      LexCtx::lexed((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
                    &s.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                     ._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                     ._M_engaged,
                    (LexCtx *)
                    &lexed_1.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                     ._M_engaged);
      if (lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._8_1_ == '\x01') {
        p_Var1 = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&s.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                     ._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                     ._M_payload._M_value.str;
        ctx.str.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = s.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                      ._M_payload.
                      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                      .
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                      ._M_engaged;
        ctx.str.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._33_7_ = s.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                  ._M_payload.
                  super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                  .
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                  ._57_7_;
        s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
        _M_payload._M_value.super_LexResult.span._M_len =
             lexed.
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
             _M_payload.
             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
             _M_payload._M_value.span._M_len;
        s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
        _M_payload._8_1_ = (undefined1)ctx.super_LexCtx.lexedSize;
        std::
        _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          *)p_Var1,
                         (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          *)&ctx.isStr);
        (__return_storage_ptr__->
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>).
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
        _M_payload._M_value.super_LexResult.span._M_len =
             ctx.str.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._32_8_;
        *(size_t *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                 )._M_payload.
                 super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                 .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
                 _M_payload._M_value.super_LexResult.span + 8) =
             s.
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
             .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
             _M_payload._M_value.super_LexResult.span._M_len;
        (__return_storage_ptr__->
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>).
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
        _M_payload._M_value.isStr =
             (bool)s.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                   ._M_payload.
                   super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                   .
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                   ._M_payload._8_1_;
        std::
        _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ::_Optional_base(&(__return_storage_ptr__->
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                          )._M_payload.
                          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                          .
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                          ._M_payload._M_value.str.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ,(_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           *)p_Var1);
        (__return_storage_ptr__->
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>).
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
        _M_engaged = true;
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset(p_Var1);
        goto LAB_00c01618;
      }
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>).
  _M_payload.
  super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>.
  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>._M_engaged =
       false;
LAB_00c01618:
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&ctx.isStr);
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexIdResult> ident(std::string_view in) {
  LexIdCtx ctx(in);
  if (!ctx.takePrefix("$"sv)) {
    return {};
  }
  if (auto s = str(ctx.next())) {
    if (!String::isUTF8(s->getStr())) {
      return {};
    }
    ctx.isStr = true;
    ctx.str = s->str;
    ctx.take(*s);
  } else if (auto lexed = idchar(ctx.next())) {
    ctx.take(*lexed);
    while (auto lexed = idchar(ctx.next())) {
      ctx.take(*lexed);
    }
  } else {
    return {};
  }
  if (ctx.canFinish()) {
    return ctx.lexed();
  }
  return {};
}